

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O1

void search_min_f_dijkstra
               (vector<int,_std::allocator<int>_> *array,
               vector<bool,_std::allocator<bool>_> *conditional,int from,int to,int *min_dist)

{
  pointer ptVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int *extraout_RDX;
  pointer ptVar5;
  int iVar6;
  vector<int,_std::allocator<int>_> *pvVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iStack_a0;
  int iStack_9c;
  thread tStack_98;
  vector<std::thread,_std::allocator<std::thread>_> vStack_90;
  vector<bool,_std::allocator<bool>_> *pvStack_70;
  int *piStack_68;
  reference_wrapper<int> rStack_60;
  reference_wrapper<std::vector<bool,_std::allocator<bool>_>_> rStack_58;
  reference_wrapper<std::vector<int,_std::allocator<int>_>_> rStack_50;
  int *piStack_48;
  
  iVar6 = 999999;
  if (from <= to) {
    conditional = (vector<bool,_std::allocator<bool>_> *)
                  (conditional->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar8 = (ulong)from;
    iVar4 = (to - from) + 1;
    do {
      iVar10 = (array->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      if (iVar10 < iVar6) {
        uVar9 = uVar8 + 0x3f;
        if (-1 < (long)uVar8) {
          uVar9 = uVar8;
        }
        if ((*(ulong *)((long)conditional +
                       (ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                       ((long)uVar9 >> 6) * 8 + -8) >> (uVar8 & 0x3f) & 1) == 0) {
          iVar6 = iVar10;
        }
      }
      uVar8 = uVar8 + 1;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  uVar2 = pthread_mutex_lock((pthread_mutex_t *)&dijkstra_min_dist);
  if (uVar2 != 0) {
    pvVar7 = (vector<int,_std::allocator<int>_> *)(ulong)uVar2;
    std::__throw_system_error(uVar2);
    vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar6 = (int)((ulong)((long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start) >> 5);
    iVar4 = 8;
    iVar10 = 0;
    pvStack_70 = conditional;
    piStack_68 = extraout_RDX;
    piStack_48 = min_dist;
    while( true ) {
      iVar3 = iVar6 + iVar10;
      iStack_a0 = (int)((ulong)((long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar7->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                     .super__Vector_impl_data._M_start) >> 2) + -1;
      if (iVar3 <= iStack_a0) {
        iStack_a0 = iVar3;
      }
      rStack_58._M_data = pvStack_70;
      rStack_60._M_data = piStack_68;
      iStack_9c = iVar10;
      rStack_50._M_data = pvVar7;
      std::thread::
      thread<void(&)(std::vector<int,std::allocator<int>>&,std::vector<bool,std::allocator<bool>>&,int,int,int&),std::reference_wrapper<std::vector<int,std::allocator<int>>>,std::reference_wrapper<std::vector<bool,std::allocator<bool>>>,int&,int&,std::reference_wrapper<int>,void>
                (&tStack_98,search_min_f_dijkstra,&rStack_50,&rStack_58,&iStack_9c,&iStack_a0,
                 &rStack_60);
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&vStack_90,&tStack_98);
      ptVar1 = vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (tStack_98._M_id._M_thread != 0) break;
      iVar10 = iVar10 + iVar6 + 1;
      iVar4 = iVar4 + -1;
      ptVar5 = vStack_90.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar4 == 0) {
        for (; ptVar5 != ptVar1; ptVar5 = ptVar5 + 1) {
          if ((ptVar5->_M_id)._M_thread != 0) {
            std::thread::join();
          }
        }
        std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&vStack_90);
        return;
      }
    }
    std::terminate();
  }
  if (iVar6 < *min_dist) {
    *min_dist = iVar6;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&dijkstra_min_dist);
  return;
}

Assistant:

void search_min_f_dijkstra(vector<int>& array, vector<bool>& conditional, int from, int to, int& min_dist){
    int local_min = MAX_INT;
    for (int i=from; i<=to; i++){
        if (array[i] < local_min && !conditional[i]){
            local_min = array[i];
        }
    }
    dijkstra_min_dist.lock();
    if (local_min < min_dist){
        min_dist = local_min;
    }
    dijkstra_min_dist.unlock();
}